

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_loop(event_base *base,int flags)

{
  bool bVar1;
  int iVar2;
  unsigned_long local_58;
  int local_4c;
  int n;
  int retval;
  int done;
  int res;
  timeval *tv_p;
  timeval tv;
  eventop *evsel;
  int flags_local;
  event_base *base_local;
  
  tv.tv_usec = (__suseconds_t)base->evsel;
  local_4c = 0;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (base->running_loop == 0) {
    base->running_loop = 1;
    clear_time_cache(base);
    if (((base->sig).ev_signal_added != 0) && ((base->sig).ev_n_signals_added != 0)) {
      evsig_set_base_(base);
    }
    bVar1 = false;
    if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
      local_58 = 1;
    }
    else {
      local_58 = (*evthread_id_fn_)();
    }
    base->th_owner_id = local_58;
    base->event_break = 0;
    base->event_gotterm = 0;
    while (!bVar1) {
      base->event_continue = 0;
      base->n_deferreds_queued = 0;
      if ((base->event_gotterm != 0) || (base->event_break != 0)) break;
      _done = (timeval *)&tv_p;
      if ((base->event_count_active == 0) && ((flags & 2U) == 0)) {
        timeout_next(base,(timeval **)&done);
      }
      else {
        tv.tv_sec = 0;
        tv_p = (timeval *)0x0;
      }
      if ((((flags & 4U) == 0) && (iVar2 = event_haveevents(base), iVar2 == 0)) &&
         (base->event_count_active == 0)) {
        if (event_debug_logging_mask_ != 0) {
          event_debugx_("%s: no events registered.","event_base_loop");
        }
        local_4c = 1;
        goto LAB_00385a47;
      }
      event_queue_make_later_events_active(base);
      clear_time_cache(base);
      iVar2 = (**(code **)(tv.tv_usec + 0x20))(base,_done);
      if (iVar2 == -1) {
        if (event_debug_logging_mask_ != 0) {
          event_debugx_("%s: dispatch returned unsuccessfully.","event_base_loop");
        }
        local_4c = -1;
        goto LAB_00385a47;
      }
      update_time_cache(base);
      timeout_process(base);
      if (base->event_count_active == 0) {
        if ((flags & 2U) != 0) {
          bVar1 = true;
        }
      }
      else {
        iVar2 = event_process_active(base);
        if ((((flags & 1U) != 0) && (base->event_count_active == 0)) && (iVar2 != 0)) {
          bVar1 = true;
        }
      }
    }
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: asked to terminate loop.","event_base_loop");
    }
LAB_00385a47:
    clear_time_cache(base);
    base->running_loop = 0;
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
    base_local._4_4_ = local_4c;
  }
  else {
    event_warnx("%s: reentrant invocation.  Only one event_base_loop can run on each event_base at once."
                ,"event_base_loop");
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
    base_local._4_4_ = -1;
  }
  return base_local._4_4_;
}

Assistant:

int
event_base_loop(struct event_base *base, int flags)
{
	const struct eventop *evsel = base->evsel;
	struct timeval tv;
	struct timeval *tv_p;
	int res, done, retval = 0;

	/* Grab the lock.  We will release it inside evsel.dispatch, and again
	 * as we invoke user callbacks. */
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (base->running_loop) {
		event_warnx("%s: reentrant invocation.  Only one event_base_loop"
		    " can run on each event_base at once.", __func__);
		EVBASE_RELEASE_LOCK(base, th_base_lock);
		return -1;
	}

	base->running_loop = 1;

	clear_time_cache(base);

	if (base->sig.ev_signal_added && base->sig.ev_n_signals_added)
		evsig_set_base_(base);

	done = 0;

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	base->th_owner_id = EVTHREAD_GET_ID();
#endif

	base->event_gotterm = base->event_break = 0;

	while (!done) {
		base->event_continue = 0;
		base->n_deferreds_queued = 0;

		/* Terminate the loop if we have been asked to */
		if (base->event_gotterm) {
			break;
		}

		if (base->event_break) {
			break;
		}

		tv_p = &tv;
		if (!N_ACTIVE_CALLBACKS(base) && !(flags & EVLOOP_NONBLOCK)) {
			timeout_next(base, &tv_p);
		} else {
			/*
			 * if we have active events, we just poll new events
			 * without waiting.
			 */
			evutil_timerclear(&tv);
		}

		/* If we have no events, we just exit */
		if (0==(flags&EVLOOP_NO_EXIT_ON_EMPTY) &&
		    !event_haveevents(base) && !N_ACTIVE_CALLBACKS(base)) {
			event_debug(("%s: no events registered.", __func__));
			retval = 1;
			goto done;
		}

		event_queue_make_later_events_active(base);

		clear_time_cache(base);

		res = evsel->dispatch(base, tv_p);

		if (res == -1) {
			event_debug(("%s: dispatch returned unsuccessfully.",
				__func__));
			retval = -1;
			goto done;
		}

		update_time_cache(base);

		timeout_process(base);

		if (N_ACTIVE_CALLBACKS(base)) {
			int n = event_process_active(base);
			if ((flags & EVLOOP_ONCE)
			    && N_ACTIVE_CALLBACKS(base) == 0
			    && n != 0)
				done = 1;
		} else if (flags & EVLOOP_NONBLOCK)
			done = 1;
	}
	event_debug(("%s: asked to terminate loop.", __func__));

done:
	clear_time_cache(base);
	base->running_loop = 0;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	return (retval);
}